

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int archive_read_format_rar_bid(archive_read *a,int best_bid)

{
  int iVar1;
  int *__s1;
  int in_ESI;
  char *buff;
  ssize_t bytes_avail;
  ssize_t window;
  ssize_t offset;
  char *p;
  size_t in_stack_ffffffffffffffb8;
  archive_read *in_stack_ffffffffffffffc0;
  long local_38;
  ulong local_30;
  long local_28;
  void *local_20;
  int local_4;
  
  if (in_ESI < 0x1f) {
    __s1 = (int *)__archive_read_ahead
                            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(ssize_t *)0x14b384
                            );
    if (__s1 == (int *)0x0) {
      local_4 = -1;
    }
    else {
      iVar1 = memcmp(__s1,"Rar!\x1a\a",7);
      if (iVar1 == 0) {
        local_4 = 0x1e;
      }
      else if ((((char)*__s1 == 'M') && (*(char *)((long)__s1 + 1) == 'Z')) || (*__s1 == 0x464c457f)
              ) {
        local_28 = 0x10000;
        local_30 = 0x1000;
        do {
          while( true ) {
            if (0x20000 < (long)(local_28 + local_30)) goto LAB_0014b4de;
            in_stack_ffffffffffffffc0 =
                 (archive_read *)
                 __archive_read_ahead
                           (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(ssize_t *)0x14b43b)
            ;
            if (in_stack_ffffffffffffffc0 == (archive_read *)0x0) break;
            for (local_20 = (void *)((long)&(in_stack_ffffffffffffffc0->archive).magic + local_28);
                (long)local_20 + 7U <
                (ulong)((long)&(in_stack_ffffffffffffffc0->archive).magic + local_38);
                local_20 = (void *)((long)local_20 + 0x10)) {
              iVar1 = memcmp(local_20,"Rar!\x1a\a",7);
              if (iVar1 == 0) {
                return 0x1e;
              }
            }
            local_28 = (long)local_20 - (long)in_stack_ffffffffffffffc0;
          }
          local_30 = (long)local_30 >> 1;
        } while (0x3f < local_30);
        local_4 = 0;
      }
      else {
LAB_0014b4de:
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
archive_read_format_rar_bid(struct archive_read *a, int best_bid)
{
  const char *p;

  /* If there's already a bid > 30, we'll never win. */
  if (best_bid > 30)
	  return (-1);

  if ((p = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (-1);

  if (memcmp(p, RAR_SIGNATURE, 7) == 0)
    return (30);

  if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
    /* This is a PE file */
    ssize_t offset = 0x10000;
    ssize_t window = 4096;
    ssize_t bytes_avail;
    while (offset + window <= (1024 * 128)) {
      const char *buff = __archive_read_ahead(a, offset + window, &bytes_avail);
      if (buff == NULL) {
        /* Remaining bytes are less than window. */
        window >>= 1;
        if (window < 0x40)
          return (0);
        continue;
      }
      p = buff + offset;
      while (p + 7 < buff + bytes_avail) {
        if (memcmp(p, RAR_SIGNATURE, 7) == 0)
          return (30);
        p += 0x10;
      }
      offset = p - buff;
    }
  }
  return (0);
}